

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O1

void __thiscall DFrameBuffer::DrawRateStuff(DFrameBuffer *this)

{
  BYTE *pBVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint32 uVar5;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  char fpsbuff [40];
  
  if (vid_fps.Value) {
    uVar2 = I_FPSTime();
    uVar10 = uVar2 - this->LastMS;
    if (-1 < (int)uVar10) {
      iVar3 = active_con_scale();
      if (iVar3 == 0) {
        iVar3 = CleanXfac;
      }
      mysnprintf(fpsbuff,0x28,"%2u ms (%3u fps)",(ulong)uVar10,(ulong)this->LastCount);
      iVar7 = (this->super_DSimpleCanvas).super_DCanvas.Width;
      iVar4 = FFont::StringWidth(ConFont,(BYTE *)fpsbuff);
      iVar4 = iVar7 / iVar3 - iVar4;
      (*(this->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                (this,(ulong)(uint)(iVar4 * iVar3),0,
                 (ulong)(uint)(this->super_DSimpleCanvas).super_DCanvas.Width,
                 (ulong)(uint)(ConFont->FontHeight * iVar3),(ulong)GPalette.BlackIndex,0);
      if (iVar3 == 1) {
        DCanvas::DrawText((DCanvas *)this,ConFont,9,iVar4,0,fpsbuff,0);
      }
      else {
        DCanvas::DrawText((DCanvas *)this,ConFont,9,iVar4,0,fpsbuff,0x40001399,
                          (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar3 &
                          0xffffffff,0x4000139a,
                          (long)(screen->super_DSimpleCanvas).super_DCanvas.Height / (long)iVar3 &
                          0xffffffff,0x400013a8,1,0);
      }
      uVar10 = uVar2 / 1000;
      uVar8 = uVar10 - this->LastSec;
      if (this->LastSec <= uVar10 && uVar8 != 0) {
        this->LastCount = this->FrameCount / uVar8;
        this->LastSec = uVar10;
        this->FrameCount = 0;
      }
      this->FrameCount = this->FrameCount + 1;
    }
    this->LastMS = uVar2;
  }
  if (ticker.Value == true) {
    uVar9 = 0;
    uVar5 = (*I_GetTime)(false);
    iVar7 = uVar5 - this->LastTic;
    pBVar1 = (this->super_DSimpleCanvas).super_DCanvas.Buffer;
    this->LastTic = uVar5;
    iVar3 = 0x14;
    if (iVar7 < 0x14) {
      iVar3 = iVar7;
    }
    if (pBVar1 == (BYTE *)0x0) {
      if (iVar7 < 1) {
        uVar2 = 0;
      }
      else {
        uVar2 = 0;
        do {
          uVar10 = (this->super_DSimpleCanvas).super_DCanvas.Height;
          (*(this->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                    (this,(ulong)uVar2,(ulong)(uVar10 - 1),(ulong)(uVar2 + 1),(ulong)uVar10,0xff,0);
          uVar2 = uVar2 + 2;
        } while (SBORROW4(uVar2,iVar3 * 2) != (int)(uVar2 + iVar3 * -2) < 0);
      }
      if (uVar2 < 0x28) {
        do {
          uVar10 = (this->super_DSimpleCanvas).super_DCanvas.Height;
          (*(this->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                    (this,(ulong)uVar2,(ulong)(uVar10 - 1),(ulong)(uVar2 + 1),(ulong)uVar10,0,0);
          bVar11 = uVar2 < 0x26;
          uVar2 = uVar2 + 2;
        } while (bVar11);
      }
    }
    else {
      iVar4 = ((this->super_DSimpleCanvas).super_DCanvas.Height + -1) *
              (this->super_DSimpleCanvas).super_DCanvas.Pitch;
      if (0 < iVar7) {
        uVar9 = 0;
        do {
          pBVar1[uVar9 + (long)iVar4] = 0xff;
          uVar9 = uVar9 + 2;
        } while (uVar9 < (uint)(iVar3 * 2));
      }
      if ((uint)uVar9 < 0x28) {
        uVar9 = (uVar9 & 0xffffffff) - 2;
        do {
          pBVar1[uVar9 + (long)iVar4 + 2] = '\0';
          uVar9 = uVar9 + 2;
        } while (uVar9 < 0x26);
      }
    }
  }
  if (vid_showpalette.Value != 0) {
    if ((DrawRateStuff()::palette == '\0') &&
       (iVar3 = __cxa_guard_acquire(&DrawRateStuff()::palette), iVar3 != 0)) {
      FPaletteTester::FPaletteTester(&DrawRateStuff::palette);
      __cxa_atexit(FTexture::~FTexture,&DrawRateStuff::palette,&__dso_handle);
      __cxa_guard_release(&DrawRateStuff()::palette);
    }
    uVar6 = 0xe0;
    if ((screen->super_DSimpleCanvas).super_DCanvas.Height < 800) {
      uVar6 = 0x70;
    }
    if (vid_showpalette.Value - 1U < 9) {
      DrawRateStuff::palette.WantTranslation = vid_showpalette.Value;
    }
    DCanvas::DrawTexture
              ((DCanvas *)this,&DrawRateStuff::palette.super_FTexture,0.0,0.0,0x40001389,uVar6,
               0x4000138a,uVar6,0x400013a5,0,0);
  }
  return;
}

Assistant:

void DFrameBuffer::DrawRateStuff ()
{
	// Draws frame time and cumulative fps
	if (vid_fps)
	{
		DWORD ms = I_FPSTime();
		DWORD howlong = ms - LastMS;
		if ((signed)howlong >= 0)
		{
			char fpsbuff[40];
			int chars;
			int rate_x;

			int textScale = active_con_scale();
			if (textScale == 0)
				textScale = CleanXfac;

			chars = mysnprintf (fpsbuff, countof(fpsbuff), "%2u ms (%3u fps)", howlong, LastCount);
			rate_x = Width / textScale - ConFont->StringWidth(&fpsbuff[0]);
			Clear (rate_x * textScale, 0, Width, ConFont->GetHeight() * textScale, GPalette.BlackIndex, 0);
			if (textScale == 1)
				DrawText (ConFont, CR_WHITE, rate_x, 0, (char *)&fpsbuff[0], TAG_DONE);
			else
				DrawText (ConFont, CR_WHITE, rate_x, 0, (char *)&fpsbuff[0],
					DTA_VirtualWidth, screen->GetWidth() / textScale,
					DTA_VirtualHeight, screen->GetHeight() / textScale,
					DTA_KeepRatio, true, TAG_DONE);

			DWORD thisSec = ms/1000;
			if (LastSec < thisSec)
			{
				LastCount = FrameCount / (thisSec - LastSec);
				LastSec = thisSec;
				FrameCount = 0;
			}
			FrameCount++;
		}
		LastMS = ms;
	}

	// draws little dots on the bottom of the screen
	if (ticker)
	{
		int i = I_GetTime(false);
		int tics = i - LastTic;
		BYTE *buffer = GetBuffer();

		LastTic = i;
		if (tics > 20) tics = 20;

		// Buffer can be NULL if we're doing hardware accelerated 2D
		if (buffer != NULL)
		{
			buffer += (GetHeight()-1) * GetPitch();
			
			for (i = 0; i < tics*2; i += 2)		buffer[i] = 0xff;
			for ( ; i < 20*2; i += 2)			buffer[i] = 0x00;
		}
		else
		{
			for (i = 0; i < tics*2; i += 2)		Clear(i, Height-1, i+1, Height, 255, 0);
			for ( ; i < 20*2; i += 2)			Clear(i, Height-1, i+1, Height, 0, 0);
		}
	}

	// draws the palette for debugging
	if (vid_showpalette)
	{
		// This used to just write the palette to the display buffer.
		// With hardware-accelerated 2D, that doesn't work anymore.
		// Drawing it as a texture does and continues to show how
		// well the PalTex shader is working.
		static FPaletteTester palette;
		int size = screen->GetHeight() < 800 ? 16 * 7 : 16 * 7 * 2;

		palette.SetTranslation(vid_showpalette);
		DrawTexture(&palette, 0, 0,
			DTA_DestWidth, size,
			DTA_DestHeight, size,
			DTA_Masked, false,
			TAG_DONE);
	}
}